

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5.cpp
# Opt level: O2

SmallString<32U> * __thiscall
llvm::MD5::MD5Result::digest(SmallString<32U> *__return_storage_ptr__,MD5Result *this)

{
  SmallVectorImpl<char> *pSVar1;
  int i;
  long lVar2;
  undefined1 local_80 [8];
  raw_svector_ostream Res;
  
  (__return_storage_ptr__->super_SmallVector<char,_32U>).super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX =
       &(__return_storage_ptr__->super_SmallVector<char,_32U>).super_SmallVectorStorage<char,_32U>;
  pSVar1 = &(__return_storage_ptr__->super_SmallVector<char,_32U>).super_SmallVectorImpl<char>;
  (pSVar1->super_SmallVectorTemplateBase<char,_true>).super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  (pSVar1->super_SmallVectorTemplateBase<char,_true>).super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x20;
  raw_svector_ostream::raw_svector_ostream
            ((raw_svector_ostream *)local_80,(SmallVectorImpl<char> *)__return_storage_ptr__);
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
    Res.OS = (SmallVectorImpl<char> *)&PTR_home_01127e18;
    raw_ostream::operator<<((raw_ostream *)local_80,(format_object_base *)&Res.OS);
  }
  raw_ostream::~raw_ostream((raw_ostream *)local_80);
  return __return_storage_ptr__;
}

Assistant:

SmallString<32> MD5::MD5Result::digest() const {
  SmallString<32> Str;
  raw_svector_ostream Res(Str);
  for (int i = 0; i < 16; ++i)
    Res << format("%.2x", Bytes[i]);
  return Str;
}